

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

void __thiscall rsg::VariableManager::declareVariable(VariableManager *this,Variable *variable)

{
  ValueEntry **__src;
  pointer *pppVVar1;
  ValueEntry **ppVVar2;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  __dest;
  pointer ppVVar3;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                     ((this->m_entryCache).
                      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->m_entryCache).
                      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  ppVVar2 = (this->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppVVar2) {
    __src = __dest._M_current + 1;
    if (__src != ppVVar2) {
      memmove(__dest._M_current,__src,(long)ppVVar2 - (long)__src);
    }
    pppVVar1 = &(this->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + -1;
  }
  for (ppVVar3 = (this->m_valueScopeStack).
                 super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar3 !=
      (this->m_valueScopeStack).
      super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar3 = ppVVar3 + 1) {
    ValueScope::removeValue(*ppVVar3,variable);
  }
  VariableScope::declare
            ((this->m_variableScopeStack).
             super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl
             .super__Vector_impl_data._M_finish[-1],variable);
  return;
}

Assistant:

void VariableManager::declareVariable (Variable* variable)
{
	// Remove from cache if exists in there.
	std::vector<const ValueEntry*>::iterator pos = std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));
	if (pos != m_entryCache.end())
		m_entryCache.erase(pos);

	DE_ASSERT(std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable)) == m_entryCache.end());

	// Remove from scope stack.
	for (vector<ValueScope*>::const_iterator stackIter = m_valueScopeStack.begin(); stackIter != m_valueScopeStack.end(); stackIter++)
	{
		ValueScope* scope = *stackIter;
		scope->removeValue(variable);
	}

	// Declare in current scope.
	getCurVariableScope().declare(variable);
}